

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autonomy2.cpp
# Opt level: O0

void __thiscall Autonomy2::mainLoop(Autonomy2 *this,bool *run)

{
  allocator<Commands::Blob> *this_00;
  __type _Var1;
  Blob blob;
  int iVar2;
  unsigned_short (*in) [60] [80];
  size_type sVar3;
  Blob BVar4;
  Control control_00;
  undefined1 auStack_134c [8];
  Control control;
  vector<Commands::Blob,_std::allocator<Commands::Blob>_> commandBlobs;
  float local_1300;
  float fStack_12fc;
  Blob targetBlob;
  list<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_> blobs;
  bool tFrame [60] [80];
  bool *run_local;
  Autonomy2 *this_local;
  
  while ((*run & 1U) != 0) {
    TripleBuffer<unsigned_short[60][80]>::swapBack(&this->buffer);
    in = TripleBuffer<unsigned_short[60][80]>::getBack(&this->buffer);
    threshold(this,(bool (*) [80])
                   &blobs.super__List_base<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_>.
                    _M_impl._M_node._M_size,(uint16_t (*) [80])in);
    findBlobs_abi_cxx11_
              ((list<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_> *)&targetBlob.size,this,
               (bool (*) [80])
               &blobs.super__List_base<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_>._M_impl.
                _M_node._M_size);
    sVar3 = std::__cxx11::list<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_>::size
                      ((list<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_> *)&targetBlob.size);
    if (sVar3 != 0) {
      BVar4 = findLargestBlob(this,(list<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_> *)
                                   &targetBlob.size);
      targetBlob.x = (float)BVar4.size;
      iVar2 = TripleBuffer<Autonomy2::Blob>::swapBackIfReady(&this->receivedTargetBuffer);
      if (iVar2 != 0) {
        _Var1 = std::sqrt<int>((int)targetBlob.x);
        this->targetDist = (float)_Var1;
      }
      sVar3 = std::__cxx11::list<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_>::size
                        ((list<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_> *)&targetBlob.size
                        );
      this_00 = (allocator<Commands::Blob> *)((long)&control.thrust + 3);
      std::allocator<Commands::Blob>::allocator(this_00);
      std::vector<Commands::Blob,_std::allocator<Commands::Blob>_>::vector
                ((vector<Commands::Blob,_std::allocator<Commands::Blob>_> *)&control.rudder,sVar3,
                 this_00);
      std::allocator<Commands::Blob>::~allocator
                ((allocator<Commands::Blob> *)((long)&control.thrust + 3));
      blobListToCmdBlobVect
                (this,(vector<Commands::Blob,_std::allocator<Commands::Blob>_> *)&control.rudder,
                 (list<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_> *)&targetBlob.size);
      Sender::sendAutonomyBlobs
                (this->send,
                 (vector<Commands::Blob,_std::allocator<Commands::Blob>_> *)&control.rudder);
      local_1300 = BVar4.x;
      fStack_12fc = BVar4.y;
      Sender::sendAutonomyBlob(this->send,(int)local_1300,(int)fStack_12fc);
      blob.size = (int)targetBlob.x;
      blob.x = (float)(int)BVar4._0_8_;
      blob.y = (float)(int)((ulong)BVar4._0_8_ >> 0x20);
      control_00 = calculateFlightControlsPID(this,blob);
      control._0_8_ = control_00._8_8_;
      auStack_134c = control_00._0_8_;
      Sender::sendAutonomyControl(this->send,control_00);
      ControlArbiter::autonomousControl(this->arbiter,(Control *)auStack_134c);
      std::vector<Commands::Blob,_std::allocator<Commands::Blob>_>::~vector
                ((vector<Commands::Blob,_std::allocator<Commands::Blob>_> *)&control.rudder);
    }
    std::__cxx11::list<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_>::~list
              ((list<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_> *)&targetBlob.size);
  }
  return;
}

Assistant:

void Autonomy2::mainLoop(bool & run) {
  while (run) {
	  buffer.swapBack();
    bool tFrame[ROWS][COLS];
	  threshold(tFrame, buffer.getBack());
    list<Blob> blobs = findBlobs(tFrame);

    // If there exists blobs
    if (blobs.size()) {
      // Calculate target blob
      Blob targetBlob = findLargestBlob(blobs);
      if (receivedTargetBuffer.swapBackIfReady()) {
        // Received target command
        targetDist = sqrt(targetBlob.size);
      }

      // Send all blobs
      vector<Commands::Blob> commandBlobs(blobs.size());
      blobListToCmdBlobVect(commandBlobs, blobs);
      send.sendAutonomyBlobs(commandBlobs);
      send.sendAutonomyBlob(targetBlob.x, targetBlob.y);

      // Calculate Controls
      Control control = calculateFlightControlsPID(targetBlob);
      send.sendAutonomyControl(control);
      arbiter.autonomousControl(control);
    }
  }
}